

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketConnection::~ThreadedSocketConnection(ThreadedSocketConnection *this)

{
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__ThreadedSocketConnection_001fe760;
  if (this->m_pSession != (Session *)0x0) {
    Session::setResponder(this->m_pSession,(Responder *)0x0);
    Session::unregisterSession(&this->m_pSession->m_sessionID);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_sessions)._M_t);
  std::__cxx11::string::~string((string *)&this->m_parser);
  std::__cxx11::string::~string((string *)&this->m_sourceAddress);
  std::__cxx11::string::~string((string *)&this->m_address);
  return;
}

Assistant:

ThreadedSocketConnection::~ThreadedSocketConnection() {
  if (m_pSession) {
    m_pSession->setResponder(0);
    Session::unregisterSession(m_pSession->getSessionID());
  }
}